

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandDrawImage::Draw(CommandDrawImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  ulong uVar1;
  bool bVar2;
  SBarInfoCommand **ppSVar3;
  long *plVar4;
  FTexture *texture;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if ((this->flags & 0x80) != 0) {
    bVar2 = (this->super_SBarInfoCommandFlowControl).truth;
    uVar12 = (ulong)(this->super_SBarInfoCommandFlowControl).commands[bVar2].
                    super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
    if (uVar12 != 0) {
      ppSVar3 = (this->super_SBarInfoCommandFlowControl).commands[bVar2].
                super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
      lVar11 = 0;
      do {
        plVar4 = *(long **)((long)ppSVar3 + lVar11);
        (**(code **)(*plVar4 + 0x10))(plVar4,block,statusBar);
        lVar11 = lVar11 + 8;
      } while (uVar12 << 3 != lVar11);
    }
  }
  texture = this->texture;
  if (texture != (FTexture *)0x0) {
    if ((this->flags & 0x20) == 0) {
      if (this->applyscale == true) {
        uVar1._0_2_ = texture->Width;
        uVar1._2_2_ = texture->Height;
        uVar1._4_2_ = texture->WidthMask;
        uVar1._6_2_ = *(undefined2 *)&texture->field_0x3e;
        auVar5._8_4_ = 0;
        auVar5._0_8_ = uVar1;
        auVar5._12_2_ = uVar1._6_2_;
        auVar7._8_2_ = uVar1._4_2_;
        auVar7._0_8_ = uVar1;
        auVar7._10_4_ = auVar5._10_4_;
        auVar9._6_8_ = 0;
        auVar9._0_6_ = auVar7._8_6_;
        auVar13._0_8_ = (double)(ushort)(undefined2)uVar1;
        auVar13._8_8_ = (double)(int)CONCAT82(SUB148(auVar9 << 0x40,6),uVar1._2_2_);
        divpd(auVar13,(undefined1  [16])texture->Scale);
      }
    }
    else {
      uVar12._0_2_ = texture->Width;
      uVar12._2_2_ = texture->Height;
      uVar12._4_2_ = texture->WidthMask;
      uVar12._6_2_ = *(undefined2 *)&texture->field_0x3e;
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar12;
      auVar6._12_2_ = uVar12._6_2_;
      auVar8._8_2_ = uVar12._4_2_;
      auVar8._0_8_ = uVar12;
      auVar8._10_4_ = auVar6._10_4_;
      auVar10._6_8_ = 0;
      auVar10._0_6_ = auVar8._8_6_;
      auVar14._0_8_ = (double)(ushort)(undefined2)uVar12;
      auVar14._8_8_ = (double)(int)CONCAT82(SUB148(auVar10 << 0x40,6),uVar12._2_2_);
      divpd(auVar14,(undefined1  [16])texture->Scale);
    }
    DSBarInfo::DrawGraphic
              (statusBar,texture,this->imgx,this->imgy,block->xOffset,block->yOffset,
               block->currentAlpha * this->alpha,block->fullScreenOffsets);
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			if(flags & DI_ALTERNATEONFAIL)
				SBarInfoCommandFlowControl::Draw(block, statusBar);

			if(texture == NULL)
				return;

			int w = maxwidth, h = maxheight;
			
			// We must calculate this per frame in order to prevent glitches with cl_capfps true.
			double frameAlpha = block->Alpha() * alpha;
			
			if(flags & DI_DRAWINBOX)
			{
				double scale1, scale2;
				scale1 = scale2 = 1.0f;
				double texwidth = (int) (texture->GetScaledWidthDouble()*spawnScaleX);
				double texheight = (int) (texture->GetScaledHeightDouble()*spawnScaleY);
				
				if (w != -1 && (w<texwidth || (flags & DI_FORCESCALE)))
				{
					scale1 = w/texwidth;
				}
				if (h != -1 && (h<texheight || (flags & DI_FORCESCALE)))
				{
					scale2 = h/texheight;
				}
				
				if (flags & DI_FORCESCALE)
				{
					if (w == -1 || (h != -1 && scale2<scale1))
						scale1=scale2;
				}
				else if (scale2<scale1) scale1=scale2;
				
				w=(int)(texwidth*scale1);
				h=(int)(texheight*scale1);
			}
			else if (applyscale)
			{
				w=(int) (texture->GetScaledWidthDouble()*spawnScaleX);
				h=(int) (texture->GetScaledHeightDouble()*spawnScaleY);
			}
			statusBar->DrawGraphic(texture, imgx, imgy, block->XOffset(), block->YOffset(), frameAlpha, block->FullScreenOffsets(),
				translatable, false, offset, false, w, h);
		}